

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu511.c
# Opt level: O0

void vepu511_h265_set_atr_regs(H265eV511RegSet *regs)

{
  H265eVepu511Sqi *pHVar1;
  RK_U32 str;
  H265eVepu511Sqi *s;
  H265eV511RegSet *regs_local;
  
  pHVar1 = &regs->reg_sqi;
  (regs->reg_sqi).block_opt_cfg =
       (anon_struct_4_9_00cd797f_for_block_opt_cfg)
       ((uint)(regs->reg_sqi).block_opt_cfg & 0xfffffffe);
  (regs->reg_sqi).cmplx_opt_cfg =
       (anon_struct_4_5_08b9bf58_for_cmplx_opt_cfg)
       ((uint)(regs->reg_sqi).cmplx_opt_cfg & 0x7fffffff);
  (regs->reg_sqi).line_opt_cfg =
       (anon_struct_4_7_7c6e74b7_for_line_opt_cfg)((uint)(regs->reg_sqi).line_opt_cfg & 0xfffffffe);
  pHVar1->subj_opt_cfg =
       (anon_struct_4_8_29983303_for_subj_opt_cfg)((uint)pHVar1->subj_opt_cfg & 0xfffffffe);
  pHVar1->subj_opt_cfg =
       (anon_struct_4_8_29983303_for_subj_opt_cfg)((uint)pHVar1->subj_opt_cfg & 0xfffffff1 | 6);
  pHVar1->subj_opt_cfg =
       (anon_struct_4_8_29983303_for_subj_opt_cfg)((uint)pHVar1->subj_opt_cfg & 0xffffffef);
  pHVar1->subj_opt_cfg =
       (anon_struct_4_8_29983303_for_subj_opt_cfg)((uint)pHVar1->subj_opt_cfg & 0xffffff1f | 0x80);
  pHVar1->subj_opt_cfg =
       (anon_struct_4_8_29983303_for_subj_opt_cfg)((uint)pHVar1->subj_opt_cfg & 0xfffffcff);
  pHVar1->subj_opt_cfg =
       (anon_struct_4_8_29983303_for_subj_opt_cfg)((uint)pHVar1->subj_opt_cfg & 0xfffffbff);
  (regs->reg_sqi).subj_opt_dpth_thd =
       (anon_struct_4_4_13e31029_for_subj_opt_dpth_thd)
       ((uint)(regs->reg_sqi).subj_opt_dpth_thd & 0xffffff00 | 0x40);
  (regs->reg_sqi).subj_opt_dpth_thd =
       (anon_struct_4_4_13e31029_for_subj_opt_dpth_thd)
       ((uint)(regs->reg_sqi).subj_opt_dpth_thd & 0xffff00ff | 0x2000);
  (regs->reg_sqi).subj_opt_dpth_thd =
       (anon_struct_4_4_13e31029_for_subj_opt_dpth_thd)
       ((uint)(regs->reg_sqi).subj_opt_dpth_thd & 0xff00ffff | 0x100000);
  (regs->reg_sqi).block_opt_cfg =
       (anon_struct_4_9_00cd797f_for_block_opt_cfg)
       ((uint)(regs->reg_sqi).block_opt_cfg & 0xfffff003 | 4000);
  (regs->reg_sqi).block_opt_cfg =
       (anon_struct_4_9_00cd797f_for_block_opt_cfg)
       ((uint)(regs->reg_sqi).block_opt_cfg & 0xffc0ffff | 0x270000);
  (regs->reg_sqi).block_opt_cfg =
       (anon_struct_4_9_00cd797f_for_block_opt_cfg)
       ((uint)(regs->reg_sqi).block_opt_cfg & 0xfcffffff | 0x3000000);
  (regs->reg_sqi).block_opt_cfg =
       (anon_struct_4_9_00cd797f_for_block_opt_cfg)
       ((uint)(regs->reg_sqi).block_opt_cfg & 0xf3ffffff | 0xc000000);
  (regs->reg_sqi).cmplx_opt_cfg =
       (anon_struct_4_5_08b9bf58_for_cmplx_opt_cfg)
       ((uint)(regs->reg_sqi).cmplx_opt_cfg & 0xffffe000 | 6000);
  (regs->reg_sqi).cmplx_opt_cfg =
       (anon_struct_4_5_08b9bf58_for_cmplx_opt_cfg)
       ((uint)(regs->reg_sqi).cmplx_opt_cfg & 0xe000ffff | 0x7d00000);
  (regs->reg_sqi).cmplx_bst_mad_thd =
       (anon_struct_4_4_46e01915_for_cmplx_bst_mad_thd)
       ((uint)(regs->reg_sqi).cmplx_bst_mad_thd & 0xffffe000 | 300);
  (regs->reg_sqi).cmplx_bst_mad_thd =
       (anon_struct_4_4_46e01915_for_cmplx_bst_mad_thd)
       ((uint)(regs->reg_sqi).cmplx_bst_mad_thd & 0xf800ffff | 0x5000000);
  (regs->reg_sqi).cmplx_bst_grdn_thd =
       (anon_struct_4_4_f5e74ee5_for_cmplx_bst_grdn_thd)
       ((uint)(regs->reg_sqi).cmplx_bst_grdn_thd & 0xfffff800);
  (regs->reg_sqi).cmplx_bst_grdn_thd =
       (anon_struct_4_4_f5e74ee5_for_cmplx_bst_grdn_thd)
       ((uint)(regs->reg_sqi).cmplx_bst_grdn_thd & 0xf800ffff | 0x2000000);
  (regs->reg_sqi).line_opt_cfg =
       (anon_struct_4_7_7c6e74b7_for_line_opt_cfg)
       ((uint)(regs->reg_sqi).line_opt_cfg & 0xffffffc1 | 6);
  (regs->reg_sqi).line_opt_cfg =
       (anon_struct_4_7_7c6e74b7_for_line_opt_cfg)
       ((uint)(regs->reg_sqi).line_opt_cfg & 0xffffc03f | 0x500);
  (regs->reg_sqi).line_opt_cfg =
       (anon_struct_4_7_7c6e74b7_for_line_opt_cfg)
       ((uint)(regs->reg_sqi).line_opt_cfg & 0xffc03fff | 0x50000);
  (regs->reg_sqi).line_opt_cfg =
       (anon_struct_4_7_7c6e74b7_for_line_opt_cfg)
       ((uint)(regs->reg_sqi).line_opt_cfg & 0xfc3fffff | 0x1c00000);
  (regs->reg_sqi).line_opt_cfg =
       (anon_struct_4_7_7c6e74b7_for_line_opt_cfg)
       ((uint)(regs->reg_sqi).line_opt_cfg & 0xc3ffffff | 0x20000000);
  (regs->reg_sqi).line_cst_bst_grdn =
       (anon_struct_4_5_b4580433_for_line_cst_bst_grdn)
       ((uint)(regs->reg_sqi).line_cst_bst_grdn & 0xffffff80 | 1);
  (regs->reg_sqi).line_cst_bst_grdn =
       (anon_struct_4_5_b4580433_for_line_cst_bst_grdn)
       ((uint)(regs->reg_sqi).line_cst_bst_grdn & 0xffff00ff | 0x4600);
  (regs->reg_sqi).line_cst_bst_grdn =
       (anon_struct_4_5_b4580433_for_line_cst_bst_grdn)
       ((uint)(regs->reg_sqi).line_cst_bst_grdn & 0xff00ffff | 0x460000);
  (regs->reg_sqi).subj_opt_dqp0 =
       (anon_struct_4_7_b5845b01_for_subj_opt_dqp0)
       ((uint)(regs->reg_sqi).subj_opt_dqp0 & 0xffffffc0 | 0x1e);
  (regs->reg_sqi).subj_opt_dqp0 =
       (anon_struct_4_7_b5845b01_for_subj_opt_dqp0)
       ((uint)(regs->reg_sqi).subj_opt_dqp0 & 0xfffffe3f | 0x100);
  (regs->reg_sqi).subj_opt_dqp0 =
       (anon_struct_4_7_b5845b01_for_subj_opt_dqp0)
       ((uint)(regs->reg_sqi).subj_opt_dqp0 & 0xffff81ff | 0x3c00);
  (regs->reg_sqi).subj_opt_dqp0 =
       (anon_struct_4_7_b5845b01_for_subj_opt_dqp0)
       ((uint)(regs->reg_sqi).subj_opt_dqp0 & 0xfffc7fff | 0x20000);
  (regs->reg_sqi).subj_opt_dqp0 =
       (anon_struct_4_7_b5845b01_for_subj_opt_dqp0)
       ((uint)(regs->reg_sqi).subj_opt_dqp0 & 0xff03ffff | 0x880000);
  (regs->reg_sqi).subj_opt_dqp0 =
       (anon_struct_4_7_b5845b01_for_subj_opt_dqp0)
       ((uint)(regs->reg_sqi).subj_opt_dqp0 & 0xc0ffffff | 0x20000000);
  return;
}

Assistant:

static void vepu511_h265_set_atr_regs(H265eV511RegSet *regs)
{
    H265eVepu511Sqi *s = &regs->reg_sqi;
    RK_U32 str = 0;

    /* 0 - disable; 1 - weak; 2 - medium; 3 - strong */
    if (str == 0) {
        s->block_opt_cfg.block_en = 0; /* block_en and cmplx_en are not used so far(20240708) */
        s->cmplx_opt_cfg.cmplx_en = 0;
        s->line_opt_cfg.line_en = 0;
    } else {
        s->block_opt_cfg.block_en = 0;
        s->cmplx_opt_cfg.cmplx_en = 0;
        s->line_opt_cfg.line_en = 1;
    }

    s->subj_opt_cfg.subj_opt_en = 0;
    s->subj_opt_cfg.subj_opt_strength = 3;
    s->subj_opt_cfg.aq_subj_en = 0;
    s->subj_opt_cfg.aq_subj_strength = 4;
    s->subj_opt_cfg.bndry_cmplx_static_choose_en = 0;
    s->subj_opt_cfg.feature_cal_en = 0;
    s->subj_opt_dpth_thd.common_thre_num_grdn_point_dep0   = 64;
    s->subj_opt_dpth_thd.common_thre_num_grdn_point_dep1   = 32;
    s->subj_opt_dpth_thd.common_thre_num_grdn_point_dep2   = 16;

    if (str == 3) {
        s->block_opt_cfg.block_thre_cst_best_mad      = 1000;
        s->block_opt_cfg.block_thre_cst_best_grdn_blk = 39;
        s->block_opt_cfg.thre_num_grdnt_point_cmplx   = 3;
        s->block_opt_cfg.block_delta_qp_flag          = 3;

        s->cmplx_opt_cfg.cmplx_thre_cst_best_mad_dep0 = 4000;
        s->cmplx_opt_cfg.cmplx_thre_cst_best_mad_dep1 = 2000;

        s->cmplx_bst_mad_thd.cmplx_thre_cst_best_mad_dep2       = 200;
        s->cmplx_bst_mad_thd.cmplx_thre_cst_best_grdn_blk_dep0  = 977;

        s->cmplx_bst_grdn_thd.cmplx_thre_cst_best_grdn_blk_dep1 = 0;
        s->cmplx_bst_grdn_thd.cmplx_thre_cst_best_grdn_blk_dep2 = 488;

        s->line_opt_cfg.line_thre_min_cst_best_grdn_blk_dep0 = 4;
        s->line_opt_cfg.line_thre_min_cst_best_grdn_blk_dep1 = 30;
        s->line_opt_cfg.line_thre_min_cst_best_grdn_blk_dep2 = 30;
        s->line_opt_cfg.line_thre_ratio_best_grdn_blk_dep0   = 7;
        s->line_opt_cfg.line_thre_ratio_best_grdn_blk_dep1   = 6;

        s->line_cst_bst_grdn.line_thre_max_cst_best_grdn_blk_dep0 = 1;
        s->line_cst_bst_grdn.line_thre_max_cst_best_grdn_blk_dep1 = 50;
        s->line_cst_bst_grdn.line_thre_max_cst_best_grdn_blk_dep2 = 50;

        s->subj_opt_dqp0.line_thre_qp   = 20;
        s->subj_opt_dqp0.block_strength = 4;
        s->subj_opt_dqp0.block_thre_qp  = 30;
        s->subj_opt_dqp0.cmplx_strength = 4;
        s->subj_opt_dqp0.cmplx_thre_qp  = 34;
        s->subj_opt_dqp0.cmplx_thre_max_grdn_blk = 32;
    } else if (str == 2) {
        s->block_opt_cfg.block_thre_cst_best_mad      = 1000;
        s->block_opt_cfg.block_thre_cst_best_grdn_blk = 39;
        s->block_opt_cfg.thre_num_grdnt_point_cmplx   = 3;
        s->block_opt_cfg.block_delta_qp_flag          = 3;

        s->cmplx_opt_cfg.cmplx_thre_cst_best_mad_dep0 = 4000;
        s->cmplx_opt_cfg.cmplx_thre_cst_best_mad_dep1 = 2000;

        s->cmplx_bst_mad_thd.cmplx_thre_cst_best_mad_dep2      = 200;
        s->cmplx_bst_mad_thd.cmplx_thre_cst_best_grdn_blk_dep0 = 977;

        s->cmplx_bst_grdn_thd.cmplx_thre_cst_best_grdn_blk_dep1 = 0;
        s->cmplx_bst_grdn_thd.cmplx_thre_cst_best_grdn_blk_dep2 = 488;

        s->line_opt_cfg.line_thre_min_cst_best_grdn_blk_dep0 = 3;
        s->line_opt_cfg.line_thre_min_cst_best_grdn_blk_dep1 = 20;
        s->line_opt_cfg.line_thre_min_cst_best_grdn_blk_dep2 = 20;
        s->line_opt_cfg.line_thre_ratio_best_grdn_blk_dep0   = 7;
        s->line_opt_cfg.line_thre_ratio_best_grdn_blk_dep1   = 8;

        s->line_cst_bst_grdn.line_thre_max_cst_best_grdn_blk_dep0 = 1;
        s->line_cst_bst_grdn.line_thre_max_cst_best_grdn_blk_dep1 = 60;
        s->line_cst_bst_grdn.line_thre_max_cst_best_grdn_blk_dep2 = 60;

        s->subj_opt_dqp0.line_thre_qp            = 25;
        s->subj_opt_dqp0.block_strength          = 4;
        s->subj_opt_dqp0.block_thre_qp           = 30;
        s->subj_opt_dqp0.cmplx_strength          = 4;
        s->subj_opt_dqp0.cmplx_thre_qp           = 34;
        s->subj_opt_dqp0.cmplx_thre_max_grdn_blk = 32;
    } else {
        s->block_opt_cfg.block_thre_cst_best_mad      = 1000;
        s->block_opt_cfg.block_thre_cst_best_grdn_blk = 39;
        s->block_opt_cfg.thre_num_grdnt_point_cmplx   = 3;
        s->block_opt_cfg.block_delta_qp_flag          = 3;

        s->cmplx_opt_cfg.cmplx_thre_cst_best_mad_dep0 = 6000;
        s->cmplx_opt_cfg.cmplx_thre_cst_best_mad_dep1 = 2000;

        s->cmplx_bst_mad_thd.cmplx_thre_cst_best_mad_dep2       = 300;
        s->cmplx_bst_mad_thd.cmplx_thre_cst_best_grdn_blk_dep0  = 1280;

        s->cmplx_bst_grdn_thd.cmplx_thre_cst_best_grdn_blk_dep1 = 0;
        s->cmplx_bst_grdn_thd.cmplx_thre_cst_best_grdn_blk_dep2 = 512;

        s->line_opt_cfg.line_thre_min_cst_best_grdn_blk_dep0 = 3;
        s->line_opt_cfg.line_thre_min_cst_best_grdn_blk_dep1 = 20;
        s->line_opt_cfg.line_thre_min_cst_best_grdn_blk_dep2 = 20;
        s->line_opt_cfg.line_thre_ratio_best_grdn_blk_dep0   = 7;
        s->line_opt_cfg.line_thre_ratio_best_grdn_blk_dep1   = 8;

        s->line_cst_bst_grdn.line_thre_max_cst_best_grdn_blk_dep0 = 1;
        s->line_cst_bst_grdn.line_thre_max_cst_best_grdn_blk_dep1 = 70;
        s->line_cst_bst_grdn.line_thre_max_cst_best_grdn_blk_dep2 = 70;

        s->subj_opt_dqp0.line_thre_qp            = 30;
        s->subj_opt_dqp0.block_strength          = 4;
        s->subj_opt_dqp0.block_thre_qp           = 30;
        s->subj_opt_dqp0.cmplx_strength          = 4;
        s->subj_opt_dqp0.cmplx_thre_qp           = 34;
        s->subj_opt_dqp0.cmplx_thre_max_grdn_blk = 32;
    }
}